

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

void connection_destroy_endpoint(ENDPOINT_HANDLE endpoint)

{
  CONNECTION_HANDLE pCVar1;
  long lVar2;
  uint32_t uVar3;
  ENDPOINT_INSTANCE **ppEVar4;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  ulong uVar5;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (endpoint == (ENDPOINT_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                 ,"connection_destroy_endpoint",0x7c5,1,"NULL endpoint");
      return;
    }
    return;
  }
  pCVar1 = endpoint->connection;
  uVar5 = (ulong)pCVar1->endpoint_count;
  bVar8 = uVar5 != 0;
  if (uVar5 == 0) goto LAB_00110829;
  if (*pCVar1->endpoints == endpoint) {
    uVar7 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if (uVar5 - 1 == uVar6) goto LAB_00110829;
      uVar7 = uVar6 + 1;
      lVar2 = uVar6 + 1;
      uVar6 = uVar7;
    } while (pCVar1->endpoints[lVar2] != endpoint);
    bVar8 = uVar7 < uVar5;
  }
  if (!bVar8) goto LAB_00110829;
  if (pCVar1->endpoint_count == 1) {
    free(pCVar1->endpoints);
    pCVar1->endpoints = (ENDPOINT_INSTANCE **)0x0;
    uVar3 = 0;
  }
  else {
    __n = 0xffffffffffffffff;
    if (uVar7 == uVar5) {
LAB_00110712:
      if (__n == 0xffffffffffffffff) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                     ,"connection_destroy_endpoint",0x7ec,1,"Cannot memmove endpoints, size:%zu",
                     0xffffffffffffffff);
        }
      }
      else {
        memmove(pCVar1->endpoints + uVar7,pCVar1->endpoints + uVar7 + 1,__n);
      }
    }
    else {
      uVar6 = uVar5 - 1;
      if (uVar5 < uVar7 || uVar7 != uVar6) {
        if (uVar7 != uVar5) {
          if (uVar7 != uVar5 && (uVar7 != uVar6 || uVar7 > uVar5)) {
            if (6 < (uint)(uVar7 - uVar5 >> 0x3d) && (uVar7 < uVar5 || uVar7 - uVar5 == 0)) {
              __n = (uVar5 + ~uVar7) * 8;
            }
          }
          else {
            __n = (ulong)(uVar7 == uVar6 && uVar7 <= uVar5) - 1;
          }
        }
        goto LAB_00110712;
      }
    }
    uVar5 = (ulong)pCVar1->endpoint_count - 1 >> 0x3d;
    uVar7 = -(ulong)(uVar5 != 0) | (ulong)pCVar1->endpoint_count * 8 - 8;
    if (uVar5 == 0) {
      ppEVar4 = (ENDPOINT_INSTANCE **)realloc(pCVar1->endpoints,uVar7);
      if (ppEVar4 == (ENDPOINT_INSTANCE **)0x0) goto LAB_001107e7;
      pCVar1->endpoints = ppEVar4;
    }
    else {
LAB_001107e7:
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                   ,"connection_destroy_endpoint",0x7f5,1,"Memory realloc failed, size:%zu",uVar7);
      }
    }
    uVar3 = pCVar1->endpoint_count - 1;
  }
  pCVar1->endpoint_count = uVar3;
LAB_00110829:
  free(endpoint);
  return;
}

Assistant:

void connection_destroy_endpoint(ENDPOINT_HANDLE endpoint)
{
    if (endpoint == NULL)
    {
        LogError("NULL endpoint");
    }
    else
    {
        CONNECTION_HANDLE connection = (CONNECTION_HANDLE)endpoint->connection;
        size_t i;

        for (i = 0; i < connection->endpoint_count; i++)
        {
            if (connection->endpoints[i] == endpoint)
            {
                break;
            }
        }

        /* Codes_S_R_S_CONNECTION_01_130: [The outgoing channel associated with the endpoint shall be released by removing the endpoint from the endpoint list.] */
        /* Codes_S_R_S_CONNECTION_01_131: [Any incoming channel number associated with the endpoint shall be released.] */
        if (i < connection->endpoint_count)
        {
            // endpoint found
            if (connection->endpoint_count == 1)
            {
                free(connection->endpoints);
                connection->endpoints = NULL;
                connection->endpoint_count = 0;
            }
            else
            {
                ENDPOINT_HANDLE* new_endpoints;
                size_t new_count = safe_subtract_size_t(safe_subtract_size_t(connection->endpoint_count, i), 1);
                if (new_count > 0)
                {
                    size_t memmove_size = safe_multiply_size_t(safe_subtract_size_t(safe_subtract_size_t(connection->endpoint_count, i), 1), sizeof(ENDPOINT_HANDLE));
                    if (memmove_size != SIZE_MAX)
                    {
                        (void)memmove(connection->endpoints + i, connection->endpoints + i + 1, memmove_size);
                    }
                    else
                    {
                        LogError("Cannot memmove endpoints, size:%zu", memmove_size);
                    }
                }

                size_t realloc_size = safe_subtract_size_t(connection->endpoint_count, 1);
                realloc_size = safe_multiply_size_t(realloc_size, sizeof(ENDPOINT_HANDLE));
                if (realloc_size == SIZE_MAX ||
                    (new_endpoints = (ENDPOINT_HANDLE*)realloc(connection->endpoints, realloc_size)) == NULL)
                {
                    LogError("Memory realloc failed, size:%zu", realloc_size);
                }
                else
                {
                    connection->endpoints = new_endpoints;
                }

                connection->endpoint_count--;
            }
        }

        free(endpoint);
    }
}